

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  i64 *pOffset;
  Pgno PVar1;
  sqlite3_io_methods *psVar2;
  Bitvec *pDone;
  Pgno *pPVar3;
  int iVar4;
  long lVar5;
  PagerSavepoint *pPVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  u32 nJRec;
  u32 dummy;
  ulong local_48;
  PagerSavepoint *local_40;
  u32 local_34;
  
  iVar4 = pPager->errCode;
  if (pPager->errCode == 0) {
    iVar4 = 0;
    if (iSavepoint < pPager->nSavepoint) {
      iVar10 = (uint)(op != 1) + iSavepoint;
      if (iVar10 < pPager->nSavepoint) {
        lVar5 = (ulong)(op != 1) + (long)iSavepoint;
        lVar8 = lVar5 * 0x30 + 0x10;
        do {
          sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar8 + -0x20));
          lVar5 = lVar5 + 1;
          lVar8 = lVar8 + 0x30;
        } while (lVar5 < pPager->nSavepoint);
      }
      pPager->nSavepoint = iVar10;
      if (op == 1) {
        iVar4 = 0;
        if (iVar10 == 0) {
          psVar2 = pPager->sjfd->pMethods;
          if (psVar2 != (sqlite3_io_methods *)0x0) {
            iVar4 = 0;
            if (psVar2 == &MemJournalMethods) {
              iVar4 = memjrnlTruncate(pPager->sjfd,0);
            }
            pPager->nSubRec = 0;
          }
        }
      }
      else if ((pPager->pWal != (Wal *)0x0) || (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0))
      {
        if (iVar10 == 0) {
          pPVar6 = (PagerSavepoint *)0x0;
        }
        else {
          pPVar6 = pPager->aSavepoint + (long)iVar10 + -1;
        }
        if (pPVar6 == (PagerSavepoint *)0x0) {
          pDone = (Bitvec *)0x0;
        }
        else {
          PVar1 = pPVar6->nOrig;
          pDone = (Bitvec *)sqlite3Malloc(0x200);
          if (pDone == (Bitvec *)0x0) {
            return 7;
          }
          memset(pDone,0,0x200);
          pDone->iSize = PVar1;
        }
        pPVar3 = &pPVar6->nOrig;
        if (pPVar6 == (PagerSavepoint *)0x0) {
          pPVar3 = &pPager->dbOrigSize;
        }
        pPager->dbSize = *pPVar3;
        pPager->changeCountDone = pPager->tempFile;
        if ((pPVar6 == (PagerSavepoint *)0x0) && (pPager->pWal != (Wal *)0x0)) {
          iVar4 = pagerRollbackWal(pPager);
          return iVar4;
        }
        pOffset = &pPager->journalOff;
        lVar5 = pPager->journalOff;
        local_40 = pPVar6;
        if ((pPVar6 == (PagerSavepoint *)0x0) || (pPager->pWal != (Wal *)0x0)) {
          *pOffset = 0;
          iVar4 = 0;
        }
        else {
          lVar8 = pPVar6->iHdrOffset;
          if (pPVar6->iHdrOffset == 0) {
            lVar8 = lVar5;
          }
          *pOffset = pPVar6->iOffset;
          do {
            if (lVar8 <= *pOffset) {
              iVar4 = 0;
              break;
            }
            iVar4 = pager_playback_one_page(pPager,pOffset,pDone,1,1);
          } while (iVar4 == 0);
        }
        if (iVar4 == 0) {
          lVar8 = pPager->journalOff;
          while (lVar8 < lVar5) {
            local_48 = local_48 & 0xffffffff00000000;
            iVar4 = readJournalHdr(pPager,0,lVar5,(u32 *)&local_48,&local_34);
            if (((uint)local_48 == 0) &&
               ((ulong)pPager->sectorSize + pPager->journalHdr == pPager->journalOff)) {
              local_48 = CONCAT44(local_48._4_4_,
                                  (int)((lVar5 - pPager->journalOff) / ((long)pPager->pageSize + 8))
                                 );
            }
            uVar7 = (uint)local_48;
            if (((uint)local_48 != 0 && iVar4 == 0) && (*pOffset < lVar5)) {
              uVar9 = 1;
              do {
                iVar4 = pager_playback_one_page(pPager,pOffset,pDone,1,1);
                if ((iVar4 != 0) || (uVar7 <= uVar9)) break;
                uVar9 = uVar9 + 1;
              } while (*pOffset < lVar5);
            }
            if (iVar4 != 0) break;
            lVar8 = *pOffset;
          }
        }
        pPVar6 = local_40;
        if (local_40 != (PagerSavepoint *)0x0) {
          local_48 = ((long)pPager->pageSize + 4) * (ulong)local_40->iSubRec;
          if (pPager->pWal != (Wal *)0x0) {
            sqlite3WalSavepointUndo(pPager->pWal,local_40->aWalData);
            iVar4 = 0;
          }
          if ((iVar4 == 0) && (uVar7 = pPVar6->iSubRec, uVar7 < pPager->nSubRec)) {
            do {
              iVar4 = pager_playback_one_page(pPager,(i64 *)&local_48,pDone,0,1);
              if (iVar4 != 0) break;
              uVar7 = uVar7 + 1;
            } while (uVar7 < pPager->nSubRec);
          }
        }
        sqlite3BitvecDestroy(pDone);
        if (iVar4 == 0) {
          *pOffset = lVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;
  
#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated 
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* If this is a release of the outermost savepoint, truncate 
    ** the sub-journal to zero bytes in size. */
    if( op==SAVEPOINT_RELEASE ){
      if( nNew==0 && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          rc = sqlite3OsTruncate(pPager->sjfd, 0);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = 0;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }
    
#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled 
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if( 
        pPager->journalMode==PAGER_JOURNALMODE_OFF 
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}